

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O1

int32 acmod_set_id2tri(acmod_set_t *acmod_set,acmod_id_t *phone,acmod_id_t *left_context,
                      acmod_id_t *right_context,word_posn_t *posn,acmod_id_t id)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  acmod_t *paVar4;
  uint uVar5;
  int32 iVar6;
  cell_index_t cVar7;
  
  uVar5 = id - acmod_set->n_ci;
  if (id < acmod_set->n_ci) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
            ,0x2e8,"ID given to acmod_set_id2tri() is a CI acoustic model ID\n");
    iVar6 = -1;
  }
  else {
    paVar4 = acmod_set->multi;
    bVar1 = paVar4[uVar5].base;
    *phone = (uint)bVar1;
    bVar2 = paVar4[uVar5].left_context;
    *left_context = (uint)bVar2;
    bVar3 = paVar4[uVar5].right_context;
    *right_context = (uint)bVar3;
    *posn = paVar4[uVar5].posn;
    if (acmod_set->n_multi == 0) {
      cVar7 = 0xffffffff;
    }
    else {
      cVar7 = itree_find_tri(acmod_set->multi_idx[bVar1],(uint)bVar2,(uint)bVar3,paVar4[uVar5].posn)
      ;
    }
    iVar6 = 0;
    if (cVar7 != id) {
      __assert_fail("acmod_set_tri2id(acmod_set, multi[addr].base, multi[addr].left_context, multi[addr].right_context, multi[addr].posn) == id"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                    ,0x2f8,
                    "int32 acmod_set_id2tri(acmod_set_t *, acmod_id_t *, acmod_id_t *, acmod_id_t *, word_posn_t *, acmod_id_t)"
                   );
    }
  }
  return iVar6;
}

Assistant:

int32
acmod_set_id2tri(acmod_set_t *acmod_set,
		 acmod_id_t *phone,
		 acmod_id_t *left_context,
		 acmod_id_t *right_context,
		 word_posn_t *posn,
		 acmod_id_t id)
{
    acmod_t *multi = acmod_set->multi;
    uint32 addr;

    if (id < acmod_set->n_ci) {
	E_ERROR("ID given to acmod_set_id2tri() is a CI acoustic model ID\n");

	return S3_ERROR;
    }

    addr = id - acmod_set->n_ci;

    *phone         = multi[addr].base;
    *left_context  = multi[addr].left_context;
    *right_context = multi[addr].right_context;
    *posn          = multi[addr].posn;

    assert(acmod_set_tri2id(acmod_set,
			    multi[addr].base,
			    multi[addr].left_context,
			    multi[addr].right_context,
			    multi[addr].posn) == id);
			    
    return S3_SUCCESS;
}